

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O3

REF_STATUS ref_matrix_ax(REF_INT rows,REF_DBL *a,REF_DBL *x,REF_DBL *ax)

{
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  double dVar5;
  
  if (0 < rows) {
    uVar1 = (ulong)(uint)rows;
    uVar2 = 0;
    do {
      ax[uVar2] = 0.0;
      dVar5 = 0.0;
      uVar4 = 0;
      pdVar3 = a;
      do {
        dVar5 = dVar5 + *pdVar3 * x[uVar4];
        ax[uVar2] = dVar5;
        uVar4 = uVar4 + 1;
        pdVar3 = pdVar3 + uVar1;
      } while (uVar1 != uVar4);
      uVar2 = uVar2 + 1;
      a = a + 1;
    } while (uVar2 != uVar1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_ax(REF_INT rows, REF_DBL *a, REF_DBL *x,
                                 REF_DBL *ax) {
  REF_INT row, col;

  for (row = 0; row < rows; row++) {
    ax[row] = 0.0;
    for (col = 0; col < rows; col++) {
      ax[row] += a[row + rows * col] * x[col];
    }
  }
  return REF_SUCCESS;
}